

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O0

int libpd_symbol(char *recv,char *symbol)

{
  t_pd *x;
  t_symbol *s;
  void *obj;
  char *symbol_local;
  char *recv_local;
  
  sys_lock();
  x = (t_pd *)get_object(recv);
  if (x == (t_pd *)0x0) {
    sys_unlock();
    recv_local._4_4_ = -1;
  }
  else {
    s = gensym(symbol);
    pd_symbol(x,s);
    sys_unlock();
    recv_local._4_4_ = 0;
  }
  return recv_local._4_4_;
}

Assistant:

int libpd_symbol(const char *recv, const char *symbol) {
  void *obj;
  sys_lock();
  obj = get_object(recv);
  if (obj == NULL)
  {
    sys_unlock();
    return -1;
  }
  pd_symbol(obj, gensym(symbol));
  sys_unlock();
  return 0;
}